

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

QRhiResource ** __thiscall
QtPrivate::QPodArrayOps<QRhiResource_*>::createHole
          (QPodArrayOps<QRhiResource_*> *this,GrowthPosition pos,qsizetype where,qsizetype n)

{
  qsizetype *pqVar1;
  QRhiResource **ppQVar2;
  long lVar3;
  long lVar4;
  QRhiResource **__src;
  
  ppQVar2 = (this->super_QArrayDataPointer<QRhiResource_*>).ptr;
  __src = ppQVar2 + where;
  if (pos == GrowsAtEnd) {
    lVar3 = (this->super_QArrayDataPointer<QRhiResource_*>).size;
    lVar4 = lVar3 - where;
    if (lVar4 != 0 && where <= lVar3) {
      memmove(__src + n,__src,lVar4 * 8);
    }
  }
  else {
    (this->super_QArrayDataPointer<QRhiResource_*>).ptr = ppQVar2 + -n;
    __src = __src + -n;
  }
  pqVar1 = &(this->super_QArrayDataPointer<QRhiResource_*>).size;
  *pqVar1 = *pqVar1 + n;
  return __src;
}

Assistant:

T *createHole(QArrayData::GrowthPosition pos, qsizetype where, qsizetype n)
    {
        Q_ASSERT((pos == QArrayData::GrowsAtBeginning && n <= this->freeSpaceAtBegin()) ||
                 (pos == QArrayData::GrowsAtEnd && n <= this->freeSpaceAtEnd()));

        T *insertionPoint = this->ptr + where;
        if (pos == QArrayData::GrowsAtEnd) {
            if (where < this->size)
                ::memmove(static_cast<void *>(insertionPoint + n), static_cast<void *>(insertionPoint), (this->size - where) * sizeof(T));
        } else {
            Q_ASSERT(where == 0);
            this->ptr -= n;
            insertionPoint -= n;
        }
        this->size += n;
        return insertionPoint;
    }